

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_checkpoint.cpp
# Opt level: O3

void ConcurrentCheckpoint::WriteRandomNumbers(DuckDB *db,bool *correct,size_t nr)

{
  undefined8 *puVar1;
  ulong uVar2;
  unsigned_long __val;
  bool bVar3;
  char cVar4;
  char cVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  ulong *puVar9;
  unsigned_long uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong __val_00;
  string __str;
  string __str_2;
  Connection con;
  char *__end;
  long *local_110;
  undefined8 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  ulong *local_c8;
  uint local_c0;
  undefined4 uStack_bc;
  ulong local_b8 [2];
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  char *local_88;
  uint local_80;
  char local_78 [16];
  bool *local_68;
  Connection local_60 [32];
  char *local_40;
  char *local_38;
  
  correct[nr] = true;
  local_68 = correct;
  duckdb::Connection::Connection(local_60,db);
  local_38 = "ROLLBACK";
  if ((nr & 1) == 0) {
    local_38 = "COMMIT";
  }
  local_40 = local_38 + (ulong)((uint)nr & 1) * 2 + 6;
  __val_00 = 0;
  do {
    local_108 = &local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"BEGIN TRANSACTION","");
    duckdb::Connection::Query((string *)&local_e8);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_e8);
    cVar5 = duckdb::BaseQueryResult::HasError();
    if (local_e8 != (ulong *)0x0) {
      (**(code **)(*local_e8 + 8))();
    }
    local_e8 = (ulong *)0x0;
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (cVar5 != '\0') {
      local_68[nr] = false;
    }
    __val = __val_00 * 2;
    cVar5 = '\x01';
    if (4 < __val_00) {
      uVar10 = __val;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar10 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_00440258;
        }
        if (uVar10 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_00440258;
        }
        if (uVar10 < 10000) goto LAB_00440258;
        bVar3 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_00440258:
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_88,local_80,__val);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x4e9fae);
    local_a8 = &local_98;
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_98 = *plVar8;
      lStack_90 = plVar6[3];
    }
    else {
      local_98 = *plVar8;
      local_a8 = (long *)*plVar6;
    }
    local_a0 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_e8 = &local_d8;
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_d8 = *puVar9;
      lStack_d0 = plVar6[3];
    }
    else {
      local_d8 = *puVar9;
      local_e8 = (ulong *)*plVar6;
    }
    local_e0 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    cVar5 = '\x01';
    if (9 < nr) {
      sVar12 = nr;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (sVar12 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_00440397;
        }
        if (sVar12 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_00440397;
        }
        if (sVar12 < 10000) goto LAB_00440397;
        bVar3 = 99999 < sVar12;
        sVar12 = sVar12 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_00440397:
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct((ulong)&local_c8,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_c8,local_c0,nr);
    uVar11 = 0xf;
    if (local_e8 != &local_d8) {
      uVar11 = local_d8;
    }
    uVar2 = CONCAT44(uStack_bc,local_c0) + local_e0;
    if (uVar11 < uVar2) {
      uVar11 = 0xf;
      if (local_c8 != local_b8) {
        uVar11 = local_b8[0];
      }
      if (uVar11 < uVar2) goto LAB_0044040a;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_0044040a:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8);
    }
    local_108 = &local_f8;
    puVar1 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar1) {
      local_f8 = *puVar1;
      uStack_f0 = puVar7[3];
    }
    else {
      local_f8 = *puVar1;
      local_108 = (undefined8 *)*puVar7;
    }
    local_100 = puVar7[1];
    *puVar7 = puVar1;
    puVar7[1] = 0;
    *(undefined1 *)puVar1 = 0;
    duckdb::Connection::Query((string *)&local_110);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_110);
    cVar5 = duckdb::BaseQueryResult::HasError();
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 8))();
    }
    local_110 = (long *)0x0;
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    if (cVar5 != '\0') {
      local_68[nr] = false;
    }
    cVar5 = '\x01';
    if (9 < __val_00) {
      uVar11 = __val_00;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar11 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_00440586;
        }
        if (uVar11 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_00440586;
        }
        if (uVar11 < 10000) goto LAB_00440586;
        bVar3 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_00440586:
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_88,local_80,__val_00);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x4e9f0a);
    local_a8 = &local_98;
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_98 = *plVar8;
      lStack_90 = plVar6[3];
    }
    else {
      local_98 = *plVar8;
      local_a8 = (long *)*plVar6;
    }
    local_a0 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_e8 = &local_d8;
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_d8 = *puVar9;
      lStack_d0 = plVar6[3];
    }
    else {
      local_d8 = *puVar9;
      local_e8 = (ulong *)*plVar6;
    }
    local_e0 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    cVar5 = '\x01';
    if (9 < nr) {
      sVar12 = nr;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (sVar12 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_004406c5;
        }
        if (sVar12 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_004406c5;
        }
        if (sVar12 < 10000) goto LAB_004406c5;
        bVar3 = 99999 < sVar12;
        sVar12 = sVar12 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_004406c5:
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct((ulong)&local_c8,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_c8,local_c0,nr);
    uVar11 = 0xf;
    if (local_e8 != &local_d8) {
      uVar11 = local_d8;
    }
    uVar2 = CONCAT44(uStack_bc,local_c0) + local_e0;
    if (uVar11 < uVar2) {
      uVar11 = 0xf;
      if (local_c8 != local_b8) {
        uVar11 = local_b8[0];
      }
      if (uVar11 < uVar2) goto LAB_00440738;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_00440738:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8);
    }
    local_108 = &local_f8;
    puVar1 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar1) {
      local_f8 = *puVar1;
      uStack_f0 = puVar7[3];
    }
    else {
      local_f8 = *puVar1;
      local_108 = (undefined8 *)*puVar7;
    }
    local_100 = puVar7[1];
    *puVar7 = puVar1;
    puVar7[1] = 0;
    *(undefined1 *)puVar1 = 0;
    duckdb::Connection::Query((string *)&local_110);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_110);
    cVar5 = duckdb::BaseQueryResult::HasError();
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 8))();
    }
    local_110 = (long *)0x0;
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    if (cVar5 != '\0') {
      local_68[nr] = false;
    }
    cVar5 = '\x01';
    if (4 < __val_00) {
      uVar10 = __val;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar10 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_004408b4;
        }
        if (uVar10 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_004408b4;
        }
        if (uVar10 < 10000) goto LAB_004408b4;
        bVar3 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_004408b4:
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_88,local_80,__val);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x4e9f0a);
    local_a8 = &local_98;
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_98 = *plVar8;
      lStack_90 = plVar6[3];
    }
    else {
      local_98 = *plVar8;
      local_a8 = (long *)*plVar6;
    }
    local_a0 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_e8 = &local_d8;
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_d8 = *puVar9;
      lStack_d0 = plVar6[3];
    }
    else {
      local_d8 = *puVar9;
      local_e8 = (ulong *)*plVar6;
    }
    local_e0 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    cVar5 = '\x01';
    if (9 < nr) {
      sVar12 = nr;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (sVar12 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_004409f3;
        }
        if (sVar12 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_004409f3;
        }
        if (sVar12 < 10000) goto LAB_004409f3;
        bVar3 = 99999 < sVar12;
        sVar12 = sVar12 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_004409f3:
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct((ulong)&local_c8,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_c8,local_c0,nr);
    uVar11 = 0xf;
    if (local_e8 != &local_d8) {
      uVar11 = local_d8;
    }
    uVar2 = CONCAT44(uStack_bc,local_c0) + local_e0;
    if (uVar11 < uVar2) {
      uVar11 = 0xf;
      if (local_c8 != local_b8) {
        uVar11 = local_b8[0];
      }
      if (uVar11 < uVar2) goto LAB_00440a66;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_00440a66:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8);
    }
    local_108 = &local_f8;
    puVar1 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar1) {
      local_f8 = *puVar1;
      uStack_f0 = puVar7[3];
    }
    else {
      local_f8 = *puVar1;
      local_108 = (undefined8 *)*puVar7;
    }
    local_100 = puVar7[1];
    *puVar7 = puVar1;
    puVar7[1] = 0;
    *(undefined1 *)puVar1 = 0;
    duckdb::Connection::Query((string *)&local_110);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_110);
    cVar5 = duckdb::BaseQueryResult::HasError();
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 8))();
    }
    local_110 = (long *)0x0;
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    if (cVar5 != '\0') {
      local_68[nr] = false;
    }
    cVar5 = '\x01';
    if (9 < __val_00) {
      uVar11 = __val_00;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar11 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_00440be2;
        }
        if (uVar11 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_00440be2;
        }
        if (uVar11 < 10000) goto LAB_00440be2;
        bVar3 = 99999 < uVar11;
        uVar11 = uVar11 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_00440be2:
    local_88 = local_78;
    std::__cxx11::string::_M_construct((ulong)&local_88,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_88,local_80,__val_00);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x4e9fae);
    local_a8 = &local_98;
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_98 = *plVar8;
      lStack_90 = plVar6[3];
    }
    else {
      local_98 = *plVar8;
      local_a8 = (long *)*plVar6;
    }
    local_a0 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_e8 = &local_d8;
    puVar9 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar9) {
      local_d8 = *puVar9;
      lStack_d0 = plVar6[3];
    }
    else {
      local_d8 = *puVar9;
      local_e8 = (ulong *)*plVar6;
    }
    local_e0 = plVar6[1];
    *plVar6 = (long)puVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    cVar5 = '\x01';
    if (9 < nr) {
      sVar12 = nr;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (sVar12 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_00440d21;
        }
        if (sVar12 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_00440d21;
        }
        if (sVar12 < 10000) goto LAB_00440d21;
        bVar3 = 99999 < sVar12;
        sVar12 = sVar12 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar3);
      cVar5 = cVar5 + '\x01';
    }
LAB_00440d21:
    local_c8 = local_b8;
    std::__cxx11::string::_M_construct((ulong)&local_c8,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_c8,local_c0,nr);
    uVar11 = 0xf;
    if (local_e8 != &local_d8) {
      uVar11 = local_d8;
    }
    uVar2 = CONCAT44(uStack_bc,local_c0) + local_e0;
    if (uVar11 < uVar2) {
      uVar11 = 0xf;
      if (local_c8 != local_b8) {
        uVar11 = local_b8[0];
      }
      if (uVar11 < uVar2) goto LAB_00440d94;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_00440d94:
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8);
    }
    local_108 = &local_f8;
    puVar1 = puVar7 + 2;
    if ((undefined8 *)*puVar7 == puVar1) {
      local_f8 = *puVar1;
      uStack_f0 = puVar7[3];
    }
    else {
      local_f8 = *puVar1;
      local_108 = (undefined8 *)*puVar7;
    }
    local_100 = puVar7[1];
    *puVar7 = puVar1;
    puVar7[1] = 0;
    *(undefined1 *)puVar1 = 0;
    duckdb::Connection::Query((string *)&local_110);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_110);
    cVar5 = duckdb::BaseQueryResult::HasError();
    if (local_110 != (long *)0x0) {
      (**(code **)(*local_110 + 8))();
    }
    local_110 = (long *)0x0;
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (local_c8 != local_b8) {
      operator_delete(local_c8);
    }
    if (local_e8 != &local_d8) {
      operator_delete(local_e8);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8);
    }
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
    if (cVar5 != '\0') {
      local_68[nr] = false;
    }
    local_108 = &local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,local_38,local_40);
    duckdb::Connection::Query((string *)&local_e8);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_e8);
    cVar5 = duckdb::BaseQueryResult::HasError();
    if (local_e8 != (ulong *)0x0) {
      (**(code **)(*local_e8 + 8))();
    }
    local_e8 = (ulong *)0x0;
    if (local_108 != &local_f8) {
      operator_delete(local_108);
    }
    if (cVar5 != '\0') {
      local_68[nr] = false;
    }
    __val_00 = __val_00 + 1;
    if (__val_00 == 200) {
      LOCK();
      finished_threads.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)
           ((long)finished_threads.super___atomic_base<unsigned_long>._M_i + 1);
      UNLOCK();
      if (finished_threads.super___atomic_base<unsigned_long>._M_i == 10) {
        LOCK();
        finished._M_base._M_i = (__atomic_base<bool>)true;
        UNLOCK();
      }
      duckdb::Connection::~Connection(local_60);
      return;
    }
  } while( true );
}

Assistant:

static void WriteRandomNumbers(DuckDB *db, bool *correct, size_t nr) {
		correct[nr] = true;
		Connection con(*db);
		for (size_t i = 0; i < CONCURRENT_UPDATE_TRANSACTION_UPDATE_COUNT; i++) {
			// just make some changes to the total
			// the total amount of money after the commit is the same
			if (con.Query("BEGIN TRANSACTION")->HasError()) {
				correct[nr] = false;
			}
			if (con.Query("UPDATE accounts SET money = money + " + to_string(i * 2) + " WHERE id = " + to_string(nr))
			        ->HasError()) {
				correct[nr] = false;
			}
			if (con.Query("UPDATE accounts SET money = money - " + to_string(i) + " WHERE id = " + to_string(nr))
			        ->HasError()) {
				correct[nr] = false;
			}
			if (con.Query("UPDATE accounts SET money = money - " + to_string(i * 2) + " WHERE id = " + to_string(nr))
			        ->HasError()) {
				correct[nr] = false;
			}
			if (con.Query("UPDATE accounts SET money = money + " + to_string(i) + " WHERE id = " + to_string(nr))
			        ->HasError()) {
				correct[nr] = false;
			}
			// we test both commit and rollback
			// the result of both should be the same since the updates have a
			// net-zero effect
			if (con.Query(nr % 2 == 0 ? "COMMIT" : "ROLLBACK")->HasError()) {
				correct[nr] = false;
			}
		}
		finished_threads++;
		if (finished_threads == CONCURRENT_UPDATE_TOTAL_ACCOUNTS) {
			finished = true;
		}
	}